

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

QByteArray * __thiscall
QMetaEnum::valueToKeys(QByteArray *__return_storage_ptr__,QMetaEnum *this,quint64 value)

{
  EnumExtendMode modes;
  quint64 qVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  uint index;
  quint64 qVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QByteArrayView local_260;
  QVarLengthArray<QByteArrayView,_32LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  if (this->mobj == (QMetaObject *)0x0) goto LAB_002633c0;
  modes = enumExtendMode(this);
  if (modes == Use64Bit) {
LAB_0026327d:
    memset(&local_250.super_QVLAStorage<16UL,_8UL,_32LL>,0xaa,0x200);
    local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.a = 0x20;
    local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.s = 0;
    index = (this->data).d[3];
    qVar6 = value;
    local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.ptr =
         &local_250.super_QVLAStorage<16UL,_8UL,_32LL>;
    do {
      iVar3 = index * 2;
      do {
        if ((int)index < 1) {
          if (local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.s != 0) {
            lVar5 = local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.s + -1;
            for (lVar2 = 0;
                local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.s << 4 != lVar2;
                lVar2 = lVar2 + 0x10) {
              lVar5 = lVar5 + *(long *)((char *)local_250.super_QVLABase<QByteArrayView>.
                                                super_QVLABaseBase.ptr + lVar2);
            }
            QByteArray::reserve(__return_storage_ptr__,lVar5);
            bVar7 = true;
            pcVar4 = (char *)local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.ptr +
                     local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.s * 0x10;
            for (lVar5 = local_250.super_QVLABase<QByteArrayView>.super_QVLABaseBase.s * -0x10;
                lVar5 != 0; lVar5 = lVar5 + 0x10) {
              if (!bVar7) {
                QByteArray::append(__return_storage_ptr__,'|');
              }
              bVar7 = false;
              QByteArray::append(__return_storage_ptr__,*(char **)(pcVar4 + -8),
                                 *(qsizetype *)(pcVar4 + -0x10));
              pcVar4 = pcVar4 + -0x10;
            }
          }
          QVarLengthArray<QByteArrayView,_32LL>::~QVarLengthArray(&local_250);
          goto LAB_002633c0;
        }
        index = index - 1;
        qVar1 = value_helper<EnumExtendMode>(this,index,modes);
        iVar3 = iVar3 + -2;
      } while ((qVar1 != value) && (qVar1 == 0 || (qVar1 & ~qVar6) != 0));
      local_260 = stringDataView(this->mobj,(this->mobj->d).data[iVar3 + (this->data).d[4]]);
      QVarLengthArray<QByteArrayView,_32LL>::emplace_back<QByteArrayView>(&local_250,&local_260);
      qVar6 = qVar6 & ~qVar1;
    } while( true );
  }
  if (modes == ZeroExtend) {
    if (value >> 0x20 == 0) goto LAB_0026327d;
  }
  else if ((long)(int)value == value) goto LAB_0026327d;
LAB_002633c0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QMetaEnum::valueToKeys(quint64 value) const
{
    QByteArray keys;
    if (!mobj)
        return keys;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return keys;

    QVarLengthArray<QByteArrayView, sizeof(int) * CHAR_BIT> parts;
    quint64 v = value;

    // reverse iterate to ensure values like Qt::Dialog=0x2|Qt::Window are processed first.
    for (int i = data.keyCount() - 1; i >= 0; --i) {
        quint64 k = value_helper(i, mode);
        if ((k != 0 && (v & k) == k) || (k == value)) {
            v = v & ~k;
            parts.push_back(stringDataView(mobj, mobj->d.data[data.data() + 2 * i]));
        }
    }
    join_reversed(keys, parts, '|');
    return keys;
}